

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_3D_K.H
# Opt level: O2

void amrex::mlndlap_bc_doit<double>
               (Box *vbx,Array4<double> *a,Box *domain,GpuArray<bool,_3U> *bflo,
               GpuArray<bool,_3U> *bfhi)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  int idim;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  double *pdVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  char cVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  char cVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  int iVar50;
  long lVar51;
  bool bVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  Box gdomain;
  int local_128;
  int local_11c;
  int local_118;
  int local_114;
  int local_e0;
  IntVect local_7c;
  long local_70;
  ulong local_68;
  ulong local_60;
  Box local_58;
  
  uVar3 = *(undefined8 *)((domain->smallend).vect + 2);
  local_58.bigend.vect[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  local_58._20_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  local_58.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  local_58.smallend.vect[2] = (int)uVar3;
  local_58.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
    if (bflo->arr[lVar20] == false) {
      piVar2 = local_58.smallend.vect + lVar20;
      *piVar2 = *piVar2 + -1;
    }
    if (bfhi->arr[lVar20] == false) {
      piVar2 = local_58.bigend.vect + lVar20;
      *piVar2 = *piVar2 + 1;
    }
  }
  bVar11 = Box::strictly_contains(&local_58,vbx);
  if (!bVar11) {
    bVar11 = (domain->btype).itype != 0;
    iVar25 = (domain->smallend).vect[0];
    iVar6 = (domain->bigend).vect[0];
    iVar7 = (vbx->smallend).vect[0];
    iVar50 = (vbx->smallend).vect[1];
    iVar45 = (vbx->smallend).vect[2];
    iVar8 = (vbx->bigend).vect[0];
    iVar9 = (vbx->bigend).vect[1];
    iVar10 = (vbx->bigend).vect[2];
    lVar20 = (long)iVar25 + -1;
    iVar28 = (domain->smallend).vect[1] + -1;
    lVar29 = (long)(domain->smallend).vect[2] + -1;
    iVar33 = (domain->bigend).vect[1] + 1;
    lVar41 = (long)(domain->bigend).vect[2] + 1;
    uVar23 = (uint)bVar11;
    uVar32 = iVar7 - 1;
    local_60 = (ulong)uVar32;
    lVar37 = (long)(int)uVar32;
    lVar38 = lVar37 * 8;
    iVar1 = iVar50 + -1;
    local_68 = (ulong)((iVar50 - uVar23) - 2);
    iVar50 = iVar45 + -1;
    iVar45 = (iVar45 - uVar23) + -2;
    iVar46 = bVar11 + 1;
    local_118 = iVar50 + iVar46;
    local_70 = (long)iVar1;
    iVar25 = iVar25 - iVar7;
    iVar13 = (iVar7 - uVar23) + -2;
    iVar31 = (iVar6 - iVar7) + 2;
    iVar7 = (int)lVar20;
    iVar14 = (uint)bVar11 + iVar7 + 1;
    iVar15 = uVar32 + iVar46;
    for (lVar51 = (long)iVar50; iVar50 = (int)lVar51, iVar50 <= iVar10 + 1; lVar51 = lVar51 + 1) {
      iVar16 = ~(uint)bVar11 + iVar50;
      iVar17 = iVar46 + iVar50;
      local_11c = (int)local_68;
      local_114 = iVar1 + iVar46;
      for (lVar49 = local_70; iVar48 = (int)lVar49, iVar48 <= iVar9 + 1; lVar49 = lVar49 + 1) {
        iVar40 = (int)lVar41;
        local_128 = (int)lVar29;
        iVar18 = ~(uint)bVar11 + iVar48;
        iVar19 = iVar46 + iVar48;
        lVar27 = 0;
        while( true ) {
          iVar35 = (int)lVar27;
          local_7c.vect[0] = (int)local_60 + iVar35;
          if (iVar8 + 1 < local_7c.vect[0]) break;
          local_7c.vect[1] = iVar48;
          local_7c.vect[2] = iVar50;
          bVar12 = Box::contains(&local_58,&local_7c);
          if (bVar12) goto LAB_006120b5;
          bVar12 = iVar25 != iVar35;
          if ((iVar48 != iVar28 || bVar12) || (iVar50 != local_128)) {
LAB_00611c95:
            bVar52 = iVar31 != iVar35;
            iVar34 = local_128;
            if ((iVar48 != iVar28 || bVar52) || (iVar50 != local_128)) {
LAB_00611ddb:
              if ((bVar12 || iVar48 != iVar33) || (iVar50 != local_128)) {
LAB_00611e2e:
                if ((!bVar52 && iVar48 == iVar33) && (iVar50 == local_128)) {
                  cVar43 = bfhi->arr[1];
                  cVar39 = bflo->arr[2];
                  if (bfhi->arr[0] != false) {
                    pdVar22 = a->p;
                    lVar21 = a->jstride;
                    iVar36 = (a->begin).x;
                    iVar34 = iVar13;
                    goto LAB_00611e75;
                  }
                  if ((bool)cVar43 != false) goto LAB_00611fd1;
                  if ((bool)cVar39 != false) goto LAB_006120c2;
                }
                if ((iVar48 != iVar28 || bVar12) || iVar50 != iVar40) {
LAB_0061213c:
                  if ((iVar48 != iVar28 || bVar52) || iVar50 != iVar40) {
LAB_0061214c:
                    if ((!bVar12 && iVar48 == iVar33) && iVar50 == iVar40) {
                      cVar39 = bfhi->arr[1];
                      cVar43 = bfhi->arr[2];
                      if (bflo->arr[0] != false) {
                        pdVar22 = a->p;
                        lVar21 = a->jstride;
                        iVar36 = (a->begin).x;
                        iVar34 = iVar15;
LAB_006124e9:
                        lVar24 = (long)iVar36;
                        lVar44 = (long)((iVar34 + iVar35) - iVar36);
                        iVar35 = (a->begin).y;
                        iVar36 = (a->begin).z;
                        lVar30 = a->kstride;
                        if (cVar39 == '\0') {
                          lVar21 = lVar21 * (iVar33 - iVar35);
                          pdVar26 = pdVar22 + lVar21 + lVar44;
                          if (cVar43 == '\0') {
                            iVar35 = iVar40 - iVar36;
                            goto LAB_00611f39;
                          }
                          uVar53 = SUB84(pdVar26[(iVar16 - iVar36) * lVar30],0);
                          uVar54 = (undefined4)((ulong)pdVar26[(iVar16 - iVar36) * lVar30] >> 0x20);
                          iVar35 = iVar40;
                          goto LAB_00611f7e;
                        }
                        pdVar26 = pdVar22 + (iVar18 - iVar35) * lVar21 + lVar44;
                        lVar44 = (long)(iVar33 - iVar35);
                        if (cVar43 == '\0') {
                          iVar35 = iVar40 - iVar36;
                          goto LAB_00611f0b;
                        }
                        uVar53 = SUB84(pdVar26[(iVar16 - iVar36) * lVar30],0);
                        uVar54 = (undefined4)((ulong)pdVar26[(iVar16 - iVar36) * lVar30] >> 0x20);
                        lVar30 = (iVar40 - iVar36) * lVar30;
                        lVar21 = lVar21 * lVar44;
                        goto LAB_00611f88;
                      }
                      if ((bool)cVar39 != false) {
LAB_006126c4:
                        pdVar22 = a->p;
                        lVar30 = a->jstride;
                        lVar24 = (long)(a->begin).x;
                        iVar35 = (a->begin).y;
                        iVar36 = (a->begin).z;
                        lVar21 = a->kstride;
                        lVar44 = (long)(iVar33 - iVar35);
                        if (cVar43 != '\0') {
                          lVar21 = lVar21 * 8;
                          lVar30 = lVar30 * 8;
                          pdVar22 = pdVar22 + lVar37;
                          uVar3 = *(undefined8 *)
                                   ((long)pdVar22 +
                                   lVar27 * 8 +
                                   (local_11c - iVar35) * lVar30 + (iVar45 - iVar36) * lVar21 +
                                   lVar24 * -8);
                          uVar53 = (undefined4)uVar3;
                          uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                          iVar34 = iVar40;
                          goto LAB_00611c41;
                        }
                        iVar36 = iVar40 - iVar36;
                        goto LAB_00612072;
                      }
                      if ((bool)cVar43 == false) goto LAB_0061215c;
LAB_0061289e:
                      if (bfhi->arr[2] != true) goto LAB_006120b5;
LAB_006128ad:
                      lVar21 = (long)(a->begin).x;
                      iVar35 = (a->begin).z;
                      lVar30 = ((long)iVar33 - (long)(a->begin).y) * a->jstride;
                      lVar24 = a->kstride * 8;
                      pdVar22 = a->p + lVar37;
                      uVar3 = *(undefined8 *)
                               ((long)pdVar22 +
                               lVar27 * 8 + (iVar45 - iVar35) * lVar24 + lVar30 * 8 + lVar21 * -8);
                      uVar53 = (undefined4)uVar3;
                      uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                      iVar36 = iVar40;
                      goto LAB_00612112;
                    }
LAB_0061215c:
                    if ((!bVar52 && iVar48 == iVar33) && iVar50 == iVar40) {
                      cVar39 = bfhi->arr[1];
                      cVar43 = bfhi->arr[2];
                      if (bfhi->arr[0] != false) {
                        pdVar22 = a->p;
                        lVar21 = a->jstride;
                        iVar36 = (a->begin).x;
                        iVar34 = iVar13;
                        goto LAB_006124e9;
                      }
                      if ((bool)cVar39 != false) goto LAB_006126c4;
                      if ((bool)cVar43 != false) goto LAB_0061289e;
                    }
                    lVar21 = (long)iVar50;
                    if ((iVar25 == iVar35) && (iVar48 == iVar28)) {
                      if (bflo->arr[0] != false) {
                        pdVar22 = a->p;
                        lVar30 = a->jstride;
                        iVar36 = (a->begin).x;
                        iVar35 = (a->begin).y;
                        lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                        lVar24 = (long)(iVar7 - iVar36);
                        iVar34 = iVar28;
                        if (bflo->arr[1] != false) {
                          uVar53 = SUB84(pdVar22[(iVar19 - iVar35) * lVar30 +
                                                 (iVar14 - iVar36) + lVar21],0);
                          uVar54 = (undefined4)
                                   ((ulong)pdVar22[(iVar19 - iVar35) * lVar30 +
                                                   (iVar14 - iVar36) + lVar21] >> 0x20);
                          iVar36 = iVar28;
LAB_006129de:
                          iVar36 = iVar36 - iVar35;
                          goto LAB_00612aec;
                        }
LAB_00612bf7:
                        pdVar22 = pdVar22 + lVar30 * (iVar34 - iVar35);
                        pdVar26 = pdVar22 + (iVar14 - iVar36);
LAB_00612cf7:
                        uVar53 = SUB84(pdVar26[lVar21],0);
                        uVar54 = (undefined4)((ulong)pdVar26[lVar21] >> 0x20);
                        goto LAB_00612cfc;
                      }
                      if (bflo->arr[1] == false) goto LAB_00612803;
                      iVar35 = (a->begin).x;
                      lVar30 = lVar20;
LAB_0061290a:
                      iVar36 = (a->begin).y;
                      lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                      dVar4 = a->p[(long)(iVar19 - iVar36) * a->jstride + (lVar30 - iVar35) + lVar21
                                  ];
                      uVar53 = SUB84(dVar4,0);
                      uVar54 = (undefined4)((ulong)dVar4 >> 0x20);
                      pdVar22 = a->p + (long)(iVar28 - iVar36) * a->jstride + (lVar30 - iVar35);
                    }
                    else {
LAB_00612803:
                      local_e0 = (int)((long)iVar6 + 1);
                      uVar32 = (uint)bVar11;
                      if ((iVar31 != iVar35) || (iVar48 != iVar28)) {
LAB_00612956:
                        lVar30 = (long)iVar7;
                        if ((iVar25 == iVar35) && (iVar48 == iVar33)) {
                          if (bflo->arr[0] != false) {
                            pdVar22 = a->p;
                            lVar30 = a->jstride;
                            iVar36 = (a->begin).x;
                            iVar35 = (a->begin).y;
                            lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                            lVar24 = (long)(iVar7 - iVar36);
                            iVar34 = iVar33;
                            if (bfhi->arr[1] == false) goto LAB_00612bf7;
                            uVar53 = SUB84(pdVar22[(iVar18 - iVar35) * lVar30 +
                                                   (iVar14 - iVar36) + lVar21],0);
                            uVar54 = (undefined4)
                                     ((ulong)pdVar22[(iVar18 - iVar35) * lVar30 +
                                                     (iVar14 - iVar36) + lVar21] >> 0x20);
                            iVar36 = iVar33;
                            goto LAB_006129de;
                          }
                          if (bfhi->arr[1] != false) {
                            lVar30 = lVar30 - (a->begin).x;
                            iVar35 = (a->begin).y;
                            lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                            dVar4 = a->p[(long)(iVar18 - iVar35) * a->jstride + lVar30 + lVar21];
                            uVar53 = SUB84(dVar4,0);
                            uVar54 = (undefined4)((ulong)dVar4 >> 0x20);
                            pdVar22 = a->p + (long)(iVar33 - iVar35) * a->jstride + lVar30;
                            goto LAB_00612d00;
                          }
                        }
                        lVar24 = (long)local_e0;
                        if ((iVar31 == iVar35) && (iVar48 == iVar33)) {
                          if (bfhi->arr[0] != false) {
                            pdVar22 = a->p;
                            lVar30 = a->jstride;
                            iVar35 = (a->begin).x;
                            lVar44 = (long)(int)(iVar6 - (uVar32 + iVar35));
                            iVar36 = (a->begin).y;
                            lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                            lVar24 = (long)(local_e0 - iVar35);
                            if (bfhi->arr[1] == false) {
                              iVar36 = iVar33 - iVar36;
                              goto LAB_00612ceb;
                            }
                            uVar53 = SUB84(pdVar22[(iVar18 - iVar36) * lVar30 + lVar44 + lVar21],0);
                            uVar54 = (undefined4)
                                     ((ulong)pdVar22[(iVar18 - iVar36) * lVar30 + lVar44 + lVar21]
                                     >> 0x20);
                            iVar36 = iVar33 - iVar36;
                            goto LAB_00612aec;
                          }
                          if (bfhi->arr[1] != false) {
                            lVar24 = lVar24 - (a->begin).x;
                            iVar35 = (a->begin).y;
                            lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                            dVar4 = a->p[(long)(iVar18 - iVar35) * a->jstride + lVar24 + lVar21];
                            uVar53 = SUB84(dVar4,0);
                            uVar54 = (undefined4)((ulong)dVar4 >> 0x20);
                            pdVar22 = a->p + (long)(iVar33 - iVar35) * a->jstride + lVar24;
                            goto LAB_00612d00;
                          }
                        }
                        lVar44 = (long)iVar48;
                        if ((iVar25 == iVar35) && (iVar50 == local_128)) {
                          if (bflo->arr[0] != false) {
                            iVar36 = (a->begin).x;
                            iVar35 = (a->begin).z;
                            lVar21 = a->kstride;
                            pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride;
                            lVar30 = (long)(iVar7 - iVar36);
                            if (bflo->arr[2] != false) {
                              uVar53 = SUB84(pdVar22[(long)(iVar14 - iVar36) +
                                                     (iVar17 - iVar35) * lVar21],0);
                              uVar54 = (undefined4)
                                       ((ulong)pdVar22[(long)(iVar14 - iVar36) +
                                                       (iVar17 - iVar35) * lVar21] >> 0x20);
                              iVar36 = local_128;
LAB_00612dd7:
                              pdVar22[lVar30 + (iVar36 - iVar35) * lVar21] =
                                   (double)CONCAT44(uVar54,uVar53);
                              goto LAB_006120b5;
                            }
LAB_00612fbd:
                            lVar21 = lVar21 * (iVar34 - iVar35);
                            uVar53 = SUB84(pdVar22[(iVar14 - iVar36) + lVar21],0);
                            uVar54 = (undefined4)
                                     ((ulong)pdVar22[(iVar14 - iVar36) + lVar21] >> 0x20);
                            pdVar22 = pdVar22 + lVar30;
LAB_00613085:
                            pdVar22[lVar21] = (double)CONCAT44(uVar54,uVar53);
                            goto LAB_006120b5;
                          }
                          if (bflo->arr[2] == false) goto LAB_00612c4b;
                          iVar35 = (a->begin).z;
                          lVar21 = a->kstride;
                          lVar42 = (iVar17 - iVar35) * lVar21;
                          pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride +
                                           (lVar30 - (a->begin).x);
LAB_00612d42:
                          uVar53 = SUB84(pdVar22[lVar42],0);
                          uVar54 = (undefined4)((ulong)pdVar22[lVar42] >> 0x20);
                          iVar36 = local_128;
LAB_00612f3b:
                          pdVar22[(iVar36 - iVar35) * lVar21] = (double)CONCAT44(uVar54,uVar53);
                          goto LAB_006120b5;
                        }
LAB_00612c4b:
                        if ((iVar31 == iVar35) && (iVar50 == local_128)) {
                          if (bfhi->arr[0] == false) {
                            if (bflo->arr[2] != false) {
                              iVar35 = (a->begin).z;
                              lVar21 = a->kstride;
                              lVar42 = (iVar17 - iVar35) * lVar21;
                              pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride +
                                               (lVar24 - (a->begin).x);
                              goto LAB_00612d42;
                            }
                            goto LAB_00612d51;
                          }
                          iVar35 = (a->begin).x;
                          iVar34 = iVar6 - (uVar32 + iVar35);
                          iVar36 = (a->begin).z;
                          lVar21 = a->kstride;
                          pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride;
                          lVar30 = (long)(local_e0 - iVar35);
                          if (bflo->arr[2] == false) {
                            lVar21 = lVar21 * (local_128 - iVar36);
                            uVar53 = SUB84(pdVar22[iVar34 + lVar21],0);
                            uVar54 = (undefined4)((ulong)pdVar22[iVar34 + lVar21] >> 0x20);
LAB_00613081:
                            pdVar22 = pdVar22 + lVar30;
                            goto LAB_00613085;
                          }
                          uVar53 = SUB84(pdVar22[(long)iVar34 + (iVar17 - iVar36) * lVar21],0);
                          uVar54 = (undefined4)
                                   ((ulong)pdVar22[(long)iVar34 + (iVar17 - iVar36) * lVar21] >>
                                   0x20);
                          iVar35 = local_128;
LAB_00612ece:
                          lVar21 = (iVar35 - iVar36) * lVar21;
                          pdVar22 = pdVar22 + lVar30;
                          goto LAB_00612d00;
                        }
LAB_00612d51:
                        if ((iVar25 == iVar35) && (iVar50 == iVar40)) {
                          if (bflo->arr[0] != false) {
                            iVar36 = (a->begin).x;
                            iVar35 = (a->begin).z;
                            lVar21 = a->kstride;
                            pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride;
                            lVar30 = (long)(iVar7 - iVar36);
                            iVar34 = iVar40;
                            if (bfhi->arr[2] == false) goto LAB_00612fbd;
                            uVar53 = SUB84(pdVar22[(long)(iVar14 - iVar36) +
                                                   (iVar16 - iVar35) * lVar21],0);
                            uVar54 = (undefined4)
                                     ((ulong)pdVar22[(long)(iVar14 - iVar36) +
                                                     (iVar16 - iVar35) * lVar21] >> 0x20);
                            iVar36 = iVar40;
                            goto LAB_00612dd7;
                          }
                          if (bfhi->arr[2] == false) goto LAB_00612e40;
                          iVar35 = (a->begin).z;
                          lVar21 = a->kstride;
                          lVar42 = (iVar16 - iVar35) * lVar21;
                          pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride +
                                           (lVar30 - (a->begin).x);
LAB_00612f31:
                          uVar53 = SUB84(pdVar22[lVar42],0);
                          uVar54 = (undefined4)((ulong)pdVar22[lVar42] >> 0x20);
                          iVar36 = iVar40;
                          goto LAB_00612f3b;
                        }
LAB_00612e40:
                        if ((iVar31 == iVar35) && (iVar50 == iVar40)) {
                          if (bfhi->arr[0] != false) {
                            iVar35 = (a->begin).x;
                            iVar34 = iVar6 - (uVar32 + iVar35);
                            iVar36 = (a->begin).z;
                            lVar21 = a->kstride;
                            pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride;
                            lVar30 = (long)(local_e0 - iVar35);
                            if (bfhi->arr[2] == false) {
                              lVar21 = lVar21 * (iVar40 - iVar36);
                              uVar53 = SUB84(pdVar22[iVar34 + lVar21],0);
                              uVar54 = (undefined4)((ulong)pdVar22[iVar34 + lVar21] >> 0x20);
                              goto LAB_00613081;
                            }
                            uVar53 = SUB84(pdVar22[(long)iVar34 + (iVar16 - iVar36) * lVar21],0);
                            uVar54 = (undefined4)
                                     ((ulong)pdVar22[(long)iVar34 + (iVar16 - iVar36) * lVar21] >>
                                     0x20);
                            iVar35 = iVar40;
                            goto LAB_00612ece;
                          }
                          if (bfhi->arr[2] != false) {
                            iVar35 = (a->begin).z;
                            lVar21 = a->kstride;
                            lVar42 = (iVar16 - iVar35) * lVar21;
                            pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride +
                                             (lVar24 - (a->begin).x);
                            goto LAB_00612f31;
                          }
                        }
                        if (iVar48 != iVar28 || iVar50 != local_128) {
LAB_00612fe2:
                          if (iVar50 != local_128 || iVar48 != iVar33) {
LAB_00613098:
                            if (iVar48 == iVar28 && iVar50 == iVar40) {
                              if (bflo->arr[1] != false) {
                                pdVar22 = a->p;
                                lVar30 = a->jstride;
                                lVar24 = (long)(a->begin).x;
                                iVar36 = (a->begin).y;
                                iVar35 = (a->begin).z;
                                lVar44 = (long)(iVar28 - iVar36);
                                if (bfhi->arr[2] == false) {
                                  lVar21 = a->kstride * (long)(iVar40 - iVar35);
                                  goto LAB_0061276c;
                                }
                                lVar21 = a->kstride * 8;
                                lVar30 = lVar30 * 8;
                                pdVar22 = pdVar22 + lVar37;
                                uVar3 = *(undefined8 *)
                                         ((long)pdVar22 +
                                         lVar27 * 8 +
                                         (local_114 - iVar36) * lVar30 + (iVar45 - iVar35) * lVar21
                                         + lVar24 * -8);
                                uVar53 = (undefined4)uVar3;
                                uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                                goto LAB_00612451;
                              }
                              if (bfhi->arr[2] != false) goto LAB_006125e5;
                            }
                            if (iVar48 == iVar33 && iVar50 == iVar40) {
                              if (bfhi->arr[1] != false) {
                                pdVar22 = a->p;
                                lVar30 = a->jstride;
                                lVar24 = (long)(a->begin).x;
                                iVar35 = (a->begin).y;
                                iVar36 = (a->begin).z;
                                lVar21 = a->kstride;
                                lVar44 = (long)(iVar33 - iVar35);
                                iVar34 = iVar40;
                                if (bfhi->arr[2] != false) {
                                  lVar21 = lVar21 * 8;
                                  lVar30 = lVar30 * 8;
                                  pdVar22 = pdVar22 + lVar37;
                                  uVar3 = *(undefined8 *)
                                           ((long)pdVar22 +
                                           lVar27 * 8 +
                                           (local_11c - iVar35) * lVar30 +
                                           (iVar45 - iVar36) * lVar21 + lVar24 * -8);
                                  uVar53 = (undefined4)uVar3;
                                  uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                                  goto LAB_0061203a;
                                }
                                goto LAB_0061345a;
                              }
                              if (bfhi->arr[2] != false) goto LAB_006128ad;
                            }
                            if ((iVar25 == iVar35) && (bflo->arr[0] == true)) {
                              local_e0 = (a->begin).x;
                              lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                              pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride;
                              uVar53 = SUB84(pdVar22[(iVar14 - local_e0) + lVar21],0);
                              uVar54 = (undefined4)
                                       ((ulong)pdVar22[(iVar14 - local_e0) + lVar21] >> 0x20);
                              local_e0 = iVar7 - local_e0;
                            }
                            else {
                              if ((iVar31 != iVar35) || (bfhi->arr[0] != true)) {
                                if ((iVar48 == iVar28) && (bflo->arr[1] == true)) {
                                  lVar21 = (long)(a->begin).x;
                                  iVar35 = (a->begin).y;
                                  lVar24 = (lVar51 - (a->begin).z) * a->kstride;
                                  lVar30 = a->jstride * 8;
                                  pdVar22 = a->p + lVar37;
                                  uVar3 = *(undefined8 *)
                                           ((long)pdVar22 +
                                           lVar27 * 8 +
                                           (local_114 - iVar35) * lVar30 + lVar24 * 8 + lVar21 * -8)
                                  ;
                                  uVar53 = (undefined4)uVar3;
                                  uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                                  iVar36 = iVar28;
LAB_00613352:
                                  lVar30 = (iVar36 - iVar35) * lVar30;
                                }
                                else {
                                  if ((iVar48 == iVar33) && (bfhi->arr[1] == true)) {
                                    lVar21 = (long)(a->begin).x;
                                    iVar35 = (a->begin).y;
                                    lVar24 = (lVar51 - (a->begin).z) * a->kstride;
                                    lVar30 = a->jstride * 8;
                                    pdVar22 = a->p + lVar37;
                                    uVar3 = *(undefined8 *)
                                             ((long)pdVar22 +
                                             lVar27 * 8 +
                                             (local_11c - iVar35) * lVar30 + lVar24 * 8 +
                                             lVar21 * -8);
                                    uVar53 = (undefined4)uVar3;
                                    uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                                    iVar36 = iVar33;
                                    goto LAB_00613352;
                                  }
                                  if ((iVar50 == local_128) && (bflo->arr[2] == true)) {
                                    lVar21 = (long)(a->begin).x;
                                    iVar35 = (a->begin).z;
                                    lVar24 = (lVar49 - (a->begin).y) * a->jstride;
                                    lVar30 = a->kstride * 8;
                                    pdVar22 = a->p + lVar37;
                                    uVar3 = *(undefined8 *)
                                             ((long)pdVar22 +
                                             lVar27 * 8 +
                                             (local_118 - iVar35) * lVar30 + lVar24 * 8 +
                                             lVar21 * -8);
                                    uVar53 = (undefined4)uVar3;
                                    uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                                    iVar36 = local_128;
                                  }
                                  else {
                                    if ((iVar50 != iVar40) || (bfhi->arr[2] != true))
                                    goto LAB_006120b5;
                                    lVar21 = (long)(a->begin).x;
                                    iVar35 = (a->begin).z;
                                    lVar24 = (lVar49 - (a->begin).y) * a->jstride;
                                    lVar30 = a->kstride * 8;
                                    pdVar22 = a->p + lVar37;
                                    uVar3 = *(undefined8 *)
                                             ((long)pdVar22 +
                                             lVar27 * 8 +
                                             (iVar45 - iVar35) * lVar30 + lVar24 * 8 + lVar21 * -8);
                                    uVar53 = (undefined4)uVar3;
                                    uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                                    iVar36 = iVar40;
                                  }
                                  lVar30 = (iVar36 - iVar35) * lVar30;
                                }
                                lVar30 = lVar30 + lVar24 * 8;
                                goto LAB_0061211f;
                              }
                              iVar35 = (a->begin).x;
                              lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                              pdVar22 = a->p + (lVar44 - (a->begin).y) * a->jstride;
                              uVar53 = SUB84(pdVar22[(int)(iVar6 - (uVar32 + iVar35)) + lVar21],0);
                              uVar54 = (undefined4)
                                       ((ulong)pdVar22[(int)(iVar6 - (uVar32 + iVar35)) + lVar21] >>
                                       0x20);
                              local_e0 = local_e0 - iVar35;
                            }
                            pdVar22 = pdVar22 + local_e0;
                            goto LAB_00612d00;
                          }
                          if (bfhi->arr[1] == false) {
                            if (bflo->arr[2] != false) goto LAB_006120c9;
                            goto LAB_00613098;
                          }
                          pdVar22 = a->p;
                          lVar30 = a->jstride;
                          lVar24 = (long)(a->begin).x;
                          iVar35 = (a->begin).y;
                          iVar36 = (a->begin).z;
                          lVar21 = a->kstride;
                          lVar44 = (long)(iVar33 - iVar35);
                          if (bflo->arr[2] != false) {
                            lVar21 = lVar21 * 8;
                            lVar42 = (local_118 - iVar36) * lVar21;
                            iVar47 = local_11c;
                            goto LAB_00613046;
                          }
LAB_0061345a:
                          lVar21 = lVar21 * (iVar34 - iVar36);
                          iVar36 = local_11c;
                        }
                        else {
                          if (bflo->arr[1] == false) {
                            if (bflo->arr[2] != false) goto LAB_00611d7a;
                            goto LAB_00612fe2;
                          }
                          pdVar22 = a->p;
                          lVar30 = a->jstride;
                          lVar24 = (long)(a->begin).x;
                          iVar35 = (a->begin).y;
                          iVar36 = (a->begin).z;
                          lVar44 = (long)(iVar28 - iVar35);
                          if (bflo->arr[2] != false) {
                            lVar21 = a->kstride * 8;
                            lVar42 = (local_118 - iVar36) * lVar21;
                            iVar47 = local_114;
LAB_00613046:
                            lVar30 = lVar30 * 8;
                            pdVar22 = pdVar22 + lVar37;
                            uVar3 = *(undefined8 *)
                                     ((long)pdVar22 +
                                     lVar27 * 8 + (iVar47 - iVar35) * lVar30 + lVar42 + lVar24 * -8)
                            ;
                            uVar53 = (undefined4)uVar3;
                            uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                            goto LAB_0061203a;
                          }
                          lVar21 = a->kstride * (long)(local_128 - iVar36);
                          iVar36 = local_114;
                        }
                        iVar36 = iVar36 - iVar35;
                        goto LAB_00612082;
                      }
                      if (bfhi->arr[0] == false) {
                        if (bflo->arr[1] != false) {
                          iVar35 = (a->begin).x;
                          lVar30 = (long)iVar6 + 1;
                          goto LAB_0061290a;
                        }
                        goto LAB_00612956;
                      }
                      pdVar22 = a->p;
                      lVar30 = a->jstride;
                      iVar35 = (a->begin).x;
                      lVar44 = (long)(int)(iVar6 - (uVar32 + iVar35));
                      iVar36 = (a->begin).y;
                      lVar21 = (lVar21 - (a->begin).z) * a->kstride;
                      lVar24 = (long)(local_e0 - iVar35);
                      if (bflo->arr[1] == false) {
                        iVar36 = iVar28 - iVar36;
LAB_00612ceb:
                        pdVar22 = pdVar22 + lVar30 * iVar36;
                        pdVar26 = pdVar22 + lVar44;
                        goto LAB_00612cf7;
                      }
                      uVar53 = SUB84(pdVar22[(iVar19 - iVar36) * lVar30 + lVar44 + lVar21],0);
                      uVar54 = (undefined4)
                               ((ulong)pdVar22[(iVar19 - iVar36) * lVar30 + lVar44 + lVar21] >> 0x20
                               );
                      iVar36 = iVar28 - iVar36;
LAB_00612aec:
                      pdVar22 = pdVar22 + iVar36 * lVar30;
LAB_00612cfc:
                      pdVar22 = pdVar22 + lVar24;
                    }
LAB_00612d00:
                    pdVar22[lVar21] = (double)CONCAT44(uVar54,uVar53);
                  }
                  else {
                    bVar5 = bfhi->arr[2];
                    if (bfhi->arr[0] != false) {
                      pdVar22 = a->p;
                      lVar21 = a->jstride;
                      iVar36 = (a->begin).x;
                      lVar24 = (long)iVar36;
                      lVar44 = (long)((iVar13 + iVar35) - iVar36);
                      iVar35 = (a->begin).y;
                      iVar36 = (a->begin).z;
                      lVar30 = a->kstride;
                      if (bflo->arr[1] == false) {
                        lVar21 = lVar21 * (iVar28 - iVar35);
                        if (bVar5 != false) {
                          uVar53 = SUB84(pdVar22[lVar21 + lVar44 + (iVar16 - iVar36) * lVar30],0);
                          uVar54 = (undefined4)
                                   ((ulong)pdVar22[lVar21 + lVar44 + (iVar16 - iVar36) * lVar30] >>
                                   0x20);
                          goto LAB_006125b7;
                        }
                        lVar30 = lVar30 * (iVar40 - iVar36);
                        uVar53 = SUB84(pdVar22[lVar21 + lVar44 + lVar30],0);
                        uVar54 = (undefined4)((ulong)pdVar22[lVar21 + lVar44 + lVar30] >> 0x20);
                      }
                      else {
                        lVar42 = (iVar19 - iVar35) * lVar21;
                        if (bVar5 != false) {
                          uVar53 = SUB84(pdVar22[lVar42 + lVar44 + (iVar16 - iVar36) * lVar30],0);
                          uVar54 = (undefined4)
                                   ((ulong)pdVar22[lVar42 + lVar44 + (iVar16 - iVar36) * lVar30] >>
                                   0x20);
                          lVar21 = lVar21 * (iVar28 - iVar35);
LAB_006125b7:
                          lVar21 = (iVar40 - iVar36) * lVar30 * 8 + lVar21 * 8;
                          goto LAB_00611faf;
                        }
                        lVar30 = lVar30 * (iVar40 - iVar36);
                        uVar53 = SUB84(pdVar22[lVar42 + lVar44 + lVar30],0);
                        uVar54 = (undefined4)((ulong)pdVar22[lVar42 + lVar44 + lVar30] >> 0x20);
                        lVar21 = lVar21 * (iVar28 - iVar35);
                      }
LAB_006127b9:
                      lVar21 = lVar30 * 8 + lVar21 * 8;
                      goto LAB_00611faf;
                    }
                    if (bflo->arr[1] == false) {
                      if (bVar5 != false) goto LAB_006125d6;
                      goto LAB_0061214c;
                    }
                    pdVar22 = a->p;
                    lVar30 = a->jstride;
                    lVar24 = (long)(a->begin).x;
                    iVar36 = (a->begin).y;
                    iVar35 = (a->begin).z;
                    lVar21 = a->kstride;
                    lVar44 = (long)(iVar28 - iVar36);
                    if (bVar5 == false) goto LAB_0061275c;
                    lVar21 = lVar21 * 8;
                    lVar30 = lVar30 * 8;
                    pdVar22 = pdVar22 + lVar37;
                    uVar3 = *(undefined8 *)
                             ((long)pdVar22 +
                             lVar27 * 8 +
                             (local_114 - iVar36) * lVar30 + (iVar45 - iVar35) * lVar21 +
                             lVar24 * -8);
                    uVar53 = (undefined4)uVar3;
                    uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
LAB_00612451:
                    *(ulong *)((long)pdVar22 +
                              lVar27 * 8 +
                              (iVar40 - iVar35) * lVar21 + lVar30 * lVar44 + lVar24 * -8) =
                         CONCAT44(uVar54,uVar53);
                  }
                }
                else {
                  bVar5 = bfhi->arr[2];
                  if (bflo->arr[0] != false) {
                    pdVar22 = a->p;
                    lVar21 = a->jstride;
                    iVar36 = (a->begin).x;
                    lVar24 = (long)iVar36;
                    lVar44 = (long)((iVar15 + iVar35) - iVar36);
                    iVar35 = (a->begin).y;
                    iVar36 = (a->begin).z;
                    lVar30 = a->kstride;
                    if (bflo->arr[1] == false) {
                      lVar21 = lVar21 * (iVar28 - iVar35);
                      if (bVar5 != false) {
                        uVar53 = SUB84(pdVar22[lVar21 + lVar44 + (iVar16 - iVar36) * lVar30],0);
                        uVar54 = (undefined4)
                                 ((ulong)pdVar22[lVar21 + lVar44 + (iVar16 - iVar36) * lVar30] >>
                                 0x20);
                        goto LAB_006125b7;
                      }
                      lVar30 = lVar30 * (iVar40 - iVar36);
                      uVar53 = SUB84(pdVar22[lVar21 + lVar44 + lVar30],0);
                      uVar54 = (undefined4)((ulong)pdVar22[lVar21 + lVar44 + lVar30] >> 0x20);
                    }
                    else {
                      lVar42 = (iVar19 - iVar35) * lVar21;
                      if (bVar5 != false) {
                        uVar53 = SUB84(pdVar22[lVar42 + lVar44 + (iVar16 - iVar36) * lVar30],0);
                        uVar54 = (undefined4)
                                 ((ulong)pdVar22[lVar42 + lVar44 + (iVar16 - iVar36) * lVar30] >>
                                 0x20);
                        lVar21 = (lVar41 - iVar36) * lVar30 * 8 + lVar21 * (iVar28 - iVar35) * 8;
                        goto LAB_00611faf;
                      }
                      lVar30 = lVar30 * (iVar40 - iVar36);
                      uVar53 = SUB84(pdVar22[lVar42 + lVar44 + lVar30],0);
                      uVar54 = (undefined4)((ulong)pdVar22[lVar42 + lVar44 + lVar30] >> 0x20);
                      lVar21 = lVar21 * (iVar28 - iVar35);
                    }
                    goto LAB_006127b9;
                  }
                  if (bflo->arr[1] == false) {
                    if (bVar5 == false) goto LAB_0061213c;
LAB_006125d6:
                    if (bfhi->arr[2] != true) goto LAB_006120b5;
LAB_006125e5:
                    lVar30 = (long)(a->begin).x;
                    iVar35 = (a->begin).z;
                    lVar21 = ((long)iVar28 - (long)(a->begin).y) * a->jstride;
                    lVar24 = a->kstride * 8;
                    pdVar22 = a->p + lVar37;
                    uVar3 = *(undefined8 *)
                             ((long)pdVar22 +
                             lVar27 * 8 + (iVar45 - iVar35) * lVar24 + lVar21 * 8 + lVar30 * -8);
                    uVar53 = (undefined4)uVar3;
                    uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                    iVar36 = iVar40;
                    goto LAB_00611dc3;
                  }
                  pdVar22 = a->p;
                  lVar30 = a->jstride;
                  lVar24 = (long)(a->begin).x;
                  iVar36 = (a->begin).y;
                  iVar35 = (a->begin).z;
                  lVar21 = a->kstride;
                  lVar44 = (long)(iVar28 - iVar36);
                  if (bVar5 != false) {
                    lVar21 = lVar21 * 8;
                    lVar30 = lVar30 * 8;
                    pdVar22 = pdVar22 + lVar37;
                    uVar3 = *(undefined8 *)
                             ((long)pdVar22 +
                             lVar27 * 8 +
                             (local_114 - iVar36) * lVar30 + (iVar45 - iVar35) * lVar21 +
                             lVar24 * -8);
                    uVar53 = (undefined4)uVar3;
                    uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                    goto LAB_00612451;
                  }
LAB_0061275c:
                  lVar21 = lVar21 * (iVar40 - iVar35);
LAB_0061276c:
                  *(undefined8 *)
                   ((long)pdVar22 +
                   lVar27 * 8 + lVar30 * 8 * lVar44 + lVar21 * 8 + lVar24 * -8 + lVar38) =
                       *(undefined8 *)
                        ((long)pdVar22 +
                        lVar27 * 8 +
                        (long)(local_114 - iVar36) * lVar30 * 8 + lVar21 * 8 + lVar24 * -8 + lVar38)
                  ;
                }
                goto LAB_006120b5;
              }
              cVar43 = bfhi->arr[1];
              cVar39 = bflo->arr[2];
              if (bflo->arr[0] != false) {
                pdVar22 = a->p;
                lVar21 = a->jstride;
                iVar36 = (a->begin).x;
                iVar34 = iVar15;
LAB_00611e75:
                lVar24 = (long)iVar36;
                lVar44 = (long)((iVar34 + iVar35) - iVar36);
                iVar35 = (a->begin).y;
                iVar36 = (a->begin).z;
                lVar30 = a->kstride;
                iVar34 = iVar33;
                if (cVar43 == '\0') goto LAB_00611f4d;
                pdVar26 = pdVar22 + (iVar18 - iVar35) * lVar21 + lVar44;
LAB_00611ead:
                if (cVar39 == '\0') {
                  lVar30 = lVar30 * (local_128 - iVar36);
                  uVar53 = SUB84(pdVar26[lVar30],0);
                  uVar54 = (undefined4)((ulong)pdVar26[lVar30] >> 0x20);
                  lVar21 = lVar21 * (iVar34 - iVar35);
                  goto LAB_00611fa7;
                }
                uVar53 = SUB84(pdVar26[(iVar17 - iVar36) * lVar30],0);
                uVar54 = (undefined4)((ulong)pdVar26[(iVar17 - iVar36) * lVar30] >> 0x20);
                lVar30 = (local_128 - iVar36) * lVar30;
                lVar21 = lVar21 * (iVar34 - iVar35);
                goto LAB_00611f88;
              }
              if ((bool)cVar43 != false) {
LAB_00611fd1:
                pdVar22 = a->p;
                lVar30 = a->jstride;
                lVar24 = (long)(a->begin).x;
                iVar35 = (a->begin).y;
                iVar36 = (a->begin).z;
                lVar21 = a->kstride;
                lVar44 = (long)(iVar33 - iVar35);
                if (cVar39 != '\0') {
                  lVar21 = lVar21 * 8;
                  lVar42 = (local_118 - iVar36) * lVar21;
                  iVar47 = local_11c;
                  goto LAB_00612013;
                }
                iVar36 = local_128 - iVar36;
LAB_00612072:
                lVar21 = lVar21 * iVar36;
                iVar36 = local_11c;
                goto LAB_0061207f;
              }
              if ((bool)cVar39 == false) goto LAB_00611e2e;
LAB_006120c2:
              if (bflo->arr[2] != true) goto LAB_006120b5;
LAB_006120c9:
              lVar21 = (long)(a->begin).x;
              iVar35 = (a->begin).z;
              lVar30 = ((long)iVar33 - (long)(a->begin).y) * a->jstride;
              lVar24 = a->kstride * 8;
              pdVar22 = a->p + lVar37;
              uVar3 = *(undefined8 *)
                       ((long)pdVar22 +
                       lVar27 * 8 + (local_118 - iVar35) * lVar24 + lVar30 * 8 + lVar21 * -8);
              uVar53 = (undefined4)uVar3;
              uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
              iVar36 = local_128;
LAB_00612112:
              lVar30 = (iVar36 - iVar35) * lVar24 + lVar30 * 8;
LAB_0061211f:
              lVar21 = lVar30 + lVar21 * -8 + (long)pdVar22;
            }
            else {
              cVar39 = bflo->arr[2];
              if (bfhi->arr[0] != false) {
                pdVar22 = a->p;
                lVar21 = a->jstride;
                iVar36 = (a->begin).x;
                lVar24 = (long)iVar36;
                lVar44 = (long)((iVar13 + iVar35) - iVar36);
                iVar35 = (a->begin).y;
                iVar36 = (a->begin).z;
                lVar30 = a->kstride;
                iVar34 = iVar28;
                if (bflo->arr[1] != false) {
                  pdVar26 = pdVar22 + (iVar19 - iVar35) * lVar21 + lVar44;
                  goto LAB_00611ead;
                }
LAB_00611f4d:
                lVar21 = lVar21 * (iVar34 - iVar35);
                if (cVar39 == '\0') {
                  lVar30 = lVar30 * (local_128 - iVar36);
                  uVar53 = SUB84(pdVar22[lVar21 + lVar44 + lVar30],0);
                  uVar54 = (undefined4)((ulong)pdVar22[lVar21 + lVar44 + lVar30] >> 0x20);
                  goto LAB_00611fa7;
                }
                uVar53 = SUB84(pdVar22[lVar21 + lVar44 + (iVar17 - iVar36) * lVar30],0);
                uVar54 = (undefined4)
                         ((ulong)pdVar22[lVar21 + lVar44 + (iVar17 - iVar36) * lVar30] >> 0x20);
                iVar35 = local_128;
LAB_00611f7e:
                iVar35 = iVar35 - iVar36;
LAB_00611f81:
                lVar30 = iVar35 * lVar30;
LAB_00611f88:
                lVar21 = lVar21 * 8 + lVar30 * 8;
                goto LAB_00611faf;
              }
              if (bflo->arr[1] == false) {
                if ((bool)cVar39 != false) goto LAB_00611d6f;
                goto LAB_00611ddb;
              }
              pdVar22 = a->p;
              lVar30 = a->jstride;
              lVar24 = (long)(a->begin).x;
              iVar35 = (a->begin).y;
              iVar36 = (a->begin).z;
              lVar21 = a->kstride;
              lVar44 = (long)(iVar28 - iVar35);
              if ((bool)cVar39 == false) goto LAB_00612058;
              lVar21 = lVar21 * 8;
              lVar42 = (local_118 - iVar36) * lVar21;
              iVar47 = local_114;
LAB_00612013:
              lVar30 = lVar30 * 8;
              pdVar22 = pdVar22 + lVar37;
              uVar3 = *(undefined8 *)
                       ((long)pdVar22 +
                       lVar27 * 8 + (iVar47 - iVar35) * lVar30 + lVar42 + lVar24 * -8);
              uVar53 = (undefined4)uVar3;
              uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
LAB_0061203a:
              iVar34 = iVar34 - iVar36;
LAB_00612040:
              lVar21 = lVar30 * lVar44 + iVar34 * lVar21;
LAB_006120aa:
              lVar21 = lVar21 + lVar24 * -8 + (long)pdVar22;
            }
            *(ulong *)(lVar21 + lVar27 * 8) = CONCAT44(uVar54,uVar53);
          }
          else {
            bVar52 = bflo->arr[2];
            if (bflo->arr[0] == false) {
              if (bflo->arr[1] != false) {
                pdVar22 = a->p;
                lVar30 = a->jstride;
                lVar24 = (long)(a->begin).x;
                iVar35 = (a->begin).y;
                iVar36 = (a->begin).z;
                lVar21 = a->kstride;
                lVar44 = (long)(iVar28 - iVar35);
                if (bVar52 != false) {
                  lVar21 = lVar21 * 8;
                  lVar30 = lVar30 * 8;
                  pdVar22 = pdVar22 + lVar37;
                  uVar3 = *(undefined8 *)
                           ((long)pdVar22 +
                           lVar27 * 8 +
                           (local_114 - iVar35) * lVar30 + (local_118 - iVar36) * lVar21 +
                           lVar24 * -8);
                  uVar53 = (undefined4)uVar3;
                  uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                  iVar34 = local_128;
LAB_00611c41:
                  iVar34 = iVar34 - iVar36;
                  goto LAB_00612040;
                }
LAB_00612058:
                lVar21 = lVar21 * (local_128 - iVar36);
                iVar36 = local_114;
LAB_0061207f:
                iVar36 = iVar36 - iVar35;
LAB_00612082:
                pdVar22 = pdVar22 + lVar37;
                uVar3 = *(undefined8 *)
                         ((long)pdVar22 +
                         lVar27 * 8 + (long)iVar36 * lVar30 * 8 + lVar21 * 8 + lVar24 * -8);
                uVar53 = (undefined4)uVar3;
                uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
                lVar21 = lVar30 * 8 * lVar44 + lVar21 * 8;
                goto LAB_006120aa;
              }
              if (bVar52 == false) goto LAB_00611c95;
LAB_00611d6f:
              if (bflo->arr[2] != true) goto LAB_006120b5;
LAB_00611d7a:
              lVar30 = (long)(a->begin).x;
              iVar35 = (a->begin).z;
              lVar21 = ((long)iVar28 - (long)(a->begin).y) * a->jstride;
              lVar24 = a->kstride * 8;
              pdVar22 = a->p + lVar37;
              uVar3 = *(undefined8 *)
                       ((long)pdVar22 +
                       lVar27 * 8 + (local_118 - iVar35) * lVar24 + lVar21 * 8 + lVar30 * -8);
              uVar53 = (undefined4)uVar3;
              uVar54 = (undefined4)((ulong)uVar3 >> 0x20);
              iVar36 = local_128;
LAB_00611dc3:
              lVar21 = (iVar36 - iVar35) * lVar24 + lVar21 * 8 + lVar30 * -8 + (long)pdVar22;
            }
            else {
              pdVar22 = a->p;
              lVar21 = a->jstride;
              iVar36 = (a->begin).x;
              lVar24 = (long)iVar36;
              lVar44 = (long)((iVar15 + iVar35) - iVar36);
              iVar36 = (a->begin).y;
              iVar35 = (a->begin).z;
              lVar30 = a->kstride;
              if (bflo->arr[1] == false) {
                lVar21 = lVar21 * (iVar28 - iVar36);
                pdVar26 = pdVar22 + lVar21 + lVar44;
                if (bVar52 != false) {
                  uVar53 = SUB84(pdVar26[(iVar17 - iVar35) * lVar30],0);
                  uVar54 = (undefined4)((ulong)pdVar26[(iVar17 - iVar35) * lVar30] >> 0x20);
                  iVar35 = local_128 - iVar35;
                  goto LAB_00611f81;
                }
                iVar35 = local_128 - iVar35;
LAB_00611f39:
                lVar30 = lVar30 * iVar35;
                uVar53 = SUB84(pdVar26[lVar30],0);
                uVar54 = (undefined4)((ulong)pdVar26[lVar30] >> 0x20);
              }
              else {
                pdVar26 = pdVar22 + (iVar19 - iVar36) * lVar21 + lVar44;
                lVar44 = (long)(iVar28 - iVar36);
                if (bVar52 != false) {
                  uVar53 = SUB84(pdVar26[(iVar17 - iVar35) * lVar30],0);
                  uVar54 = (undefined4)((ulong)pdVar26[(iVar17 - iVar35) * lVar30] >> 0x20);
                  lVar21 = lVar21 * lVar44 * 8 + (lVar29 - iVar35) * lVar30 * 8;
                  goto LAB_00611faf;
                }
                iVar35 = local_128 - iVar35;
LAB_00611f0b:
                lVar30 = lVar30 * iVar35;
                uVar53 = SUB84(pdVar26[lVar30],0);
                uVar54 = (undefined4)((ulong)pdVar26[lVar30] >> 0x20);
                lVar21 = lVar21 * lVar44;
              }
LAB_00611fa7:
              lVar21 = lVar21 * 8 + lVar30 * 8;
LAB_00611faf:
              lVar21 = (long)pdVar22 + lVar21 + lVar24 * -8 + lVar38;
            }
            *(ulong *)(lVar21 + lVar27 * 8) = CONCAT44(uVar54,uVar53);
          }
LAB_006120b5:
          lVar27 = lVar27 + 1;
        }
        local_114 = local_114 + 1;
        local_11c = local_11c + 1;
      }
      local_118 = local_118 + 1;
      iVar45 = iVar45 + 1;
    }
  }
  return;
}

Assistant:

inline void mlndlap_bc_doit (Box const& vbx, Array4<T> const& a, Box const& domain,
                             GpuArray<bool,AMREX_SPACEDIM> const& bflo,
                             GpuArray<bool,AMREX_SPACEDIM> const& bfhi) noexcept
{
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (! bflo[idim]) gdomain.growLo(idim,1);
        if (! bfhi[idim]) gdomain.growHi(idim,1);
    }

    if (gdomain.strictly_contains(vbx)) return;

    const int offset = domain.cellCentered() ? 0 : 1;

    const auto dlo = amrex::lbound(domain);
    const auto dhi = amrex::ubound(domain);

    Box const& sbox = amrex::grow(vbx,1);
    AMREX_HOST_DEVICE_FOR_3D(sbox, i, j, k,
    {
        if (! gdomain.contains(IntVect(i,j,k))) {
            // xlo & ylo & zlo
            if (i == dlo.x-1 && j == dlo.y-1 && k == dlo.z-1 && (bflo[0] || bflo[1] || bflo[2]))
            {
                if (bflo[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k+1+offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & ylo & zlo
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dlo.z-1 && (bfhi[0] || bflo[1] || bflo[2]))
            {
                if (bfhi[0] && bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k+1+offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & yhi & zlo
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dlo.z-1 && (bflo[0] || bfhi[1] || bflo[2]))
            {
                if (bflo[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k+1+offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & yhi & zlo
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dlo.z-1 && (bfhi[0] || bfhi[1] || bflo[2]))
            {
                if (bfhi[0] && bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k+1+offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & ylo & zhi
            else if (i == dlo.x-1 && j == dlo.y-1 && k == dhi.z+1 && (bflo[0] || bflo[1] || bfhi[2]))
            {
                if (bflo[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k-1-offset);
                }
                else if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & ylo & zhi
            else if (i == dhi.x+1 && j == dlo.y-1 && k == dhi.z+1 && (bfhi[0] || bflo[1] || bfhi[2]))
            {
                if (bfhi[0] && bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k-1-offset);
                }
                else if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & yhi & zhi
            else if (i == dlo.x-1 && j == dhi.y+1 && k == dhi.z+1 && (bflo[0] || bfhi[1] || bfhi[2]))
            {
                if (bflo[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k-1-offset);
                }
                else if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & yhi & zhi
            else if (i == dhi.x+1 && j == dhi.y+1 && k == dhi.z+1 && (bfhi[0] || bfhi[1] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k-1-offset);
                }
                else if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xlo & ylo
            else if (i == dlo.x-1 && j == dlo.y-1 && (bflo[0] || bflo[1]))
            {
                if (bflo[0] && bflo[1])
                {
                    a(i,j,k) = a(i+1+offset, j+1+offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xhi & ylo
            else if (i == dhi.x+1 && j == dlo.y-1 && (bfhi[0] || bflo[1]))
            {
                if (bfhi[0] && bflo[1])
                {
                    a(i,j,k) = a(i-1-offset, j+1+offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
            }
            // xlo & yhi
            else if (i == dlo.x-1 && j == dhi.y+1 && (bflo[0] || bfhi[1]))
            {
                if (bflo[0] && bfhi[1])
                {
                    a(i,j,k) = a(i+1+offset, j-1-offset, k);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xhi & yhi
            else if (i == dhi.x+1 && j == dhi.y+1 && (bfhi[0] || bfhi[1]))
            {
                if (bfhi[0] && bfhi[1])
                {
                    a(i,j,k) = a(i-1-offset, j-1-offset, k);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
            }
            // xlo & zlo
            else if (i == dlo.x-1 && k == dlo.z-1 && (bflo[0] || bflo[2]))
            {
                if (bflo[0] && bflo[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k+1+offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xhi & zlo
            else if (i == dhi.x+1 && k == dlo.z-1 && (bfhi[0] || bflo[2]))
            {
                if (bfhi[0] && bflo[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k+1+offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // xlo & zhi
            else if (i == dlo.x-1 && k == dhi.z+1 && (bflo[0] || bfhi[2]))
            {
                if (bflo[0] && bfhi[2])
                {
                    a(i,j,k) = a(i+1+offset, j, k-1-offset);
                }
                else if (bflo[0])
                {
                    a(i,j,k) = a(i+1+offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // xhi & zhi
            else if (i == dhi.x+1 && k == dhi.z+1 && (bfhi[0] || bfhi[2]))
            {
                if (bfhi[0] && bfhi[2])
                {
                    a(i,j,k) = a(i-1-offset, j, k-1-offset);
                }
                else if (bfhi[0])
                {
                    a(i,j,k) = a(i-1-offset, j, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // ylo & zlo
            else if (j == dlo.y-1 && k == dlo.z-1 && (bflo[1] || bflo[2]))
            {
                if (bflo[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k+1+offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // yhi & zlo
            else if (j == dhi.y+1 && k == dlo.z-1 && (bfhi[1] || bflo[2]))
            {
                if (bfhi[1] && bflo[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k+1+offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bflo[2])
                {
                    a(i,j,k) = a(i, j, k+1+offset);
                }
            }
            // ylo & zhi
            else if (j == dlo.y-1 && k == dhi.z+1 && (bflo[1] || bfhi[2]))
            {
                if (bflo[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j+1+offset, k-1-offset);
                }
                else if (bflo[1])
                {
                    a(i,j,k) = a(i, j+1+offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            // yhi & zhi
            else if (j == dhi.y+1 && k == dhi.z+1 && (bfhi[1] || bfhi[2]))
            {
                if (bfhi[1] && bfhi[2])
                {
                    a(i,j,k) = a(i, j-1-offset, k-1-offset);
                }
                else if (bfhi[1])
                {
                    a(i,j,k) = a(i, j-1-offset, k);
                }
                else if (bfhi[2])
                {
                    a(i,j,k) = a(i, j, k-1-offset);
                }
            }
            else if (i == dlo.x-1 && bflo[0])
            {
                a(i,j,k) = a(i+1+offset, j, k);
            }
            else if (i == dhi.x+1 && bfhi[0])
            {
                a(i,j,k) = a(i-1-offset, j, k);
            }
            else if (j == dlo.y-1 && bflo[1])
            {
                a(i,j,k) = a(i, j+1+offset, k);
            }
            else if (j == dhi.y+1 && bfhi[1])
            {
                a(i,j,k) = a(i, j-1-offset, k);
            }
            else if (k == dlo.z-1 && bflo[2])
            {
                a(i,j,k) = a(i, j, k+1+offset);
            }
            else if (k == dhi.z+1 && bfhi[2])
            {
                a(i,j,k) = a(i, j, k-1-offset);
            }
        }
    });
}